

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_convolve_sse2.c
# Opt level: O3

void aom_highbd_filter_block1d8_h4_sse2
               (uint16_t *src_ptr,ptrdiff_t src_pitch,uint16_t *dst_ptr,ptrdiff_t dst_pitch,
               uint32_t height,int16_t *filter,int bd)

{
  short sVar1;
  undefined1 auVar9 [16];
  short sVar10;
  short sVar11;
  undefined1 (*pauVar12) [16];
  undefined4 in_XMM0_Db;
  undefined4 in_XMM0_Dc;
  __m128i filtersReg;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  short sVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  
  if (height != 0) {
    auVar13 = ZEXT416((uint)~(-1 << ((byte)filter & 0x1f)));
    auVar13 = pshuflw(auVar13,auVar13,0);
    pauVar12 = (undefined1 (*) [16])(src_ptr + 3);
    do {
      auVar18 = *(undefined1 (*) [16])(pauVar12[-1] + 8);
      auVar9 = *pauVar12;
      auVar14._0_8_ = auVar18._4_8_;
      auVar14._8_8_ = auVar9._4_8_;
      auVar15._4_4_ = in_XMM0_Db;
      auVar15._0_4_ = in_XMM0_Db;
      auVar15._8_4_ = in_XMM0_Db;
      auVar15._12_4_ = in_XMM0_Db;
      auVar20 = pmaddwd(auVar18,auVar15);
      auVar22._4_4_ = in_XMM0_Dc;
      auVar22._0_4_ = in_XMM0_Dc;
      auVar22._8_4_ = in_XMM0_Dc;
      auVar22._12_4_ = in_XMM0_Dc;
      auVar15 = pmaddwd(auVar14,auVar22);
      auVar21._0_8_ = auVar18._2_8_;
      auVar21._8_8_ = auVar9._2_8_;
      auVar17._0_8_ = auVar18._6_8_;
      auVar17._8_8_ = auVar9._6_8_;
      auVar18._4_4_ = in_XMM0_Db;
      auVar18._0_4_ = in_XMM0_Db;
      auVar18._8_4_ = in_XMM0_Db;
      auVar18._12_4_ = in_XMM0_Db;
      auVar22 = pmaddwd(auVar21,auVar18);
      auVar9._4_4_ = in_XMM0_Dc;
      auVar9._0_4_ = in_XMM0_Dc;
      auVar9._8_4_ = in_XMM0_Dc;
      auVar9._12_4_ = in_XMM0_Dc;
      auVar18 = pmaddwd(auVar17,auVar9);
      auVar19._0_4_ = auVar15._0_4_ + auVar20._0_4_ + 0x40 >> 7;
      auVar19._4_4_ = auVar18._0_4_ + auVar22._0_4_ + 0x40 >> 7;
      auVar19._8_4_ = auVar15._4_4_ + auVar20._4_4_ + 0x40 >> 7;
      auVar19._12_4_ = auVar18._4_4_ + auVar22._4_4_ + 0x40 >> 7;
      auVar16._0_4_ = auVar15._8_4_ + auVar20._8_4_ + 0x40 >> 7;
      auVar16._4_4_ = auVar18._8_4_ + auVar22._8_4_ + 0x40 >> 7;
      auVar16._8_4_ = auVar15._12_4_ + auVar20._12_4_ + 0x40 >> 7;
      auVar16._12_4_ = auVar18._12_4_ + auVar22._12_4_ + 0x40 >> 7;
      auVar18 = packssdw(auVar19,auVar16);
      sVar1 = (ushort)(-1 < auVar18._0_2_) * auVar18._0_2_;
      sVar2 = (ushort)(-1 < auVar18._2_2_) * auVar18._2_2_;
      sVar3 = (ushort)(-1 < auVar18._4_2_) * auVar18._4_2_;
      sVar4 = (ushort)(-1 < auVar18._6_2_) * auVar18._6_2_;
      sVar5 = (ushort)(-1 < auVar18._8_2_) * auVar18._8_2_;
      sVar6 = (ushort)(-1 < auVar18._10_2_) * auVar18._10_2_;
      sVar7 = (ushort)(-1 < auVar18._12_2_) * auVar18._12_2_;
      sVar8 = (ushort)(-1 < auVar18._14_2_) * auVar18._14_2_;
      sVar10 = auVar13._0_2_;
      sVar11 = auVar13._2_2_;
      *dst_ptr = (ushort)(sVar10 < sVar1) * sVar10 | (ushort)(sVar10 >= sVar1) * sVar1;
      dst_ptr[1] = (ushort)(sVar11 < sVar2) * sVar11 | (ushort)(sVar11 >= sVar2) * sVar2;
      dst_ptr[2] = (ushort)(sVar10 < sVar3) * sVar10 | (ushort)(sVar10 >= sVar3) * sVar3;
      dst_ptr[3] = (ushort)(sVar11 < sVar4) * sVar11 | (ushort)(sVar11 >= sVar4) * sVar4;
      dst_ptr[4] = (ushort)(sVar10 < sVar5) * sVar10 | (ushort)(sVar10 >= sVar5) * sVar5;
      dst_ptr[5] = (ushort)(sVar11 < sVar6) * sVar11 | (ushort)(sVar11 >= sVar6) * sVar6;
      dst_ptr[6] = (ushort)(sVar10 < sVar7) * sVar10 | (ushort)(sVar10 >= sVar7) * sVar7;
      dst_ptr[7] = (ushort)(sVar11 < sVar8) * sVar11 | (ushort)(sVar11 >= sVar8) * sVar8;
      pauVar12 = (undefined1 (*) [16])(*pauVar12 + src_pitch * 2);
      dst_ptr = dst_ptr + dst_pitch;
      height = height - 1;
    } while (height != 0);
  }
  return;
}

Assistant:

static void aom_highbd_filter_block1d8_h4_sse2(
    const uint16_t *src_ptr, ptrdiff_t src_pitch, uint16_t *dst_ptr,
    ptrdiff_t dst_pitch, uint32_t height, const int16_t *filter, int bd) {
  __m128i filtersReg;
  __m128i addFilterReg64;
  __m128i secondFilters, thirdFilters;
  __m128i srcRegFilt32b1_1, srcRegFilt32b1_2;
  __m128i srcReg32b1, srcReg32b2;
  unsigned int i;
  src_ptr -= 3;
  addFilterReg64 = _mm_set1_epi32(64);
  filtersReg = _mm_loadu_si128((const __m128i *)filter);
  const __m128i max = _mm_set1_epi16((1 << bd) - 1);

  // coeffs 0 1 0 1 2 3 2 3
  const __m128i tmp_0 = _mm_unpacklo_epi32(filtersReg, filtersReg);
  // coeffs 4 5 4 5 6 7 6 7
  const __m128i tmp_1 = _mm_unpackhi_epi32(filtersReg, filtersReg);

  secondFilters = _mm_unpackhi_epi64(tmp_0, tmp_0);  // coeffs 2 3 2 3 2 3 2 3
  thirdFilters = _mm_unpacklo_epi64(tmp_1, tmp_1);   // coeffs 4 5 4 5 4 5 4 5

  for (i = height; i > 0; i -= 1) {
    srcReg32b1 = _mm_loadu_si128((const __m128i *)(src_ptr + 2));
    srcReg32b2 = _mm_loadu_si128((const __m128i *)(src_ptr + 6));

    __m128i ss_4_1 = _mm_srli_si128(srcReg32b1, 4);
    __m128i ss_4_2 = _mm_srli_si128(srcReg32b2, 4);
    __m128i ss_4 = _mm_unpacklo_epi64(ss_4_1, ss_4_2);

    __m128i d1 = _mm_madd_epi16(srcReg32b1, secondFilters);
    __m128i d2 = _mm_madd_epi16(ss_4, thirdFilters);
    srcRegFilt32b1_1 = _mm_add_epi32(d1, d2);

    __m128i ss_3_1 = _mm_srli_si128(srcReg32b1, 2);
    __m128i ss_5_1 = _mm_srli_si128(srcReg32b1, 6);
    __m128i ss_3_2 = _mm_srli_si128(srcReg32b2, 2);
    __m128i ss_5_2 = _mm_srli_si128(srcReg32b2, 6);
    __m128i ss_3 = _mm_unpacklo_epi64(ss_3_1, ss_3_2);
    __m128i ss_5 = _mm_unpacklo_epi64(ss_5_1, ss_5_2);

    d1 = _mm_madd_epi16(ss_3, secondFilters);
    d2 = _mm_madd_epi16(ss_5, thirdFilters);
    srcRegFilt32b1_2 = _mm_add_epi32(d1, d2);

    __m128i res_lo_1 = _mm_unpacklo_epi32(srcRegFilt32b1_1, srcRegFilt32b1_2);
    __m128i res_hi_1 = _mm_unpackhi_epi32(srcRegFilt32b1_1, srcRegFilt32b1_2);

    // shift by 7 bit each 32 bit
    res_lo_1 = _mm_add_epi32(res_lo_1, addFilterReg64);
    res_hi_1 = _mm_add_epi32(res_hi_1, addFilterReg64);
    res_lo_1 = _mm_srai_epi32(res_lo_1, 7);
    res_hi_1 = _mm_srai_epi32(res_hi_1, 7);

    srcRegFilt32b1_1 = _mm_packs_epi32(res_lo_1, res_hi_1);

    srcRegFilt32b1_1 = _mm_max_epi16(srcRegFilt32b1_1, _mm_setzero_si128());
    srcRegFilt32b1_1 = _mm_min_epi16(srcRegFilt32b1_1, max);

    src_ptr += src_pitch;

    _mm_store_si128((__m128i *)dst_ptr, srcRegFilt32b1_1);

    dst_ptr += dst_pitch;
  }
}